

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O3

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
          (cmGeneratorExpressionDAGChecker *this,cmGeneratorTarget *tgt,ForGenex genex)

{
  long lVar1;
  long *__s1;
  size_type sVar2;
  int iVar3;
  cmGeneratorExpressionDAGChecker *pcVar4;
  size_type __rlen;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  do {
    pcVar4 = this;
    this = pcVar4->Parent;
  } while (pcVar4->Parent != (cmGeneratorExpressionDAGChecker *)0x0);
  __s1 = (long *)(pcVar4->Property)._M_dataplus._M_p;
  sVar2 = (pcVar4->Property)._M_string_length;
  if (tgt == (cmGeneratorTarget *)0x0) {
    if ((long)sVar2 < 0x1f) {
      if (sVar2 == 0xe) {
        if (*(long *)((long)__s1 + 6) == 0x5345495241524249 && *__s1 == 0x42494c5f4b4e494c)
        goto LAB_004d2140;
      }
      else if (sVar2 == 0x18) {
        lVar1 = __s1[2];
        auVar9[0] = -((char)lVar1 == 'I');
        auVar9[1] = -((char)((ulong)lVar1 >> 8) == 'B');
        auVar9[2] = -((char)((ulong)lVar1 >> 0x10) == 'R');
        auVar9[3] = -((char)((ulong)lVar1 >> 0x18) == 'A');
        auVar9[4] = -((char)((ulong)lVar1 >> 0x20) == 'R');
        auVar9[5] = -((char)((ulong)lVar1 >> 0x28) == 'I');
        auVar9[6] = -((char)((ulong)lVar1 >> 0x30) == 'E');
        auVar9[7] = -((char)((ulong)lVar1 >> 0x38) == 'S');
        auVar9[8] = 0xff;
        auVar9[9] = 0xff;
        auVar9[10] = 0xff;
        auVar9[0xb] = 0xff;
        auVar9[0xc] = 0xff;
        auVar9[0xd] = 0xff;
        auVar9[0xe] = 0xff;
        auVar9[0xf] = 0xff;
        auVar6[0] = -((char)*__s1 == 'I');
        auVar6[1] = -(*(char *)((long)__s1 + 1) == 'N');
        auVar6[2] = -(*(char *)((long)__s1 + 2) == 'T');
        auVar6[3] = -(*(char *)((long)__s1 + 3) == 'E');
        auVar6[4] = -(*(char *)((long)__s1 + 4) == 'R');
        auVar6[5] = -(*(char *)((long)__s1 + 5) == 'F');
        auVar6[6] = -(*(char *)((long)__s1 + 6) == 'A');
        auVar6[7] = -(*(char *)((long)__s1 + 7) == 'C');
        auVar6[8] = -((char)__s1[1] == 'E');
        auVar6[9] = -(*(char *)((long)__s1 + 9) == '_');
        auVar6[10] = -(*(char *)((long)__s1 + 10) == 'L');
        auVar6[0xb] = -(*(char *)((long)__s1 + 0xb) == 'I');
        auVar6[0xc] = -(*(char *)((long)__s1 + 0xc) == 'N');
        auVar6[0xd] = -(*(char *)((long)__s1 + 0xd) == 'K');
        auVar6[0xe] = -(*(char *)((long)__s1 + 0xe) == '_');
        auVar6[0xf] = -(*(char *)((long)__s1 + 0xf) == 'L');
        auVar6 = auVar6 & auVar9;
        if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
          return true;
        }
        lVar1 = __s1[2];
        auVar10[0] = -((char)lVar1 == 'I');
        auVar10[1] = -((char)((ulong)lVar1 >> 8) == 'B');
        auVar10[2] = -((char)((ulong)lVar1 >> 0x10) == 'R');
        auVar10[3] = -((char)((ulong)lVar1 >> 0x18) == 'A');
        auVar10[4] = -((char)((ulong)lVar1 >> 0x20) == 'R');
        auVar10[5] = -((char)((ulong)lVar1 >> 0x28) == 'I');
        auVar10[6] = -((char)((ulong)lVar1 >> 0x30) == 'E');
        auVar10[7] = -((char)((ulong)lVar1 >> 0x38) == 'S');
        auVar10[8] = 0xff;
        auVar10[9] = 0xff;
        auVar10[10] = 0xff;
        auVar10[0xb] = 0xff;
        auVar10[0xc] = 0xff;
        auVar10[0xd] = 0xff;
        auVar10[0xe] = 0xff;
        auVar10[0xf] = 0xff;
        auVar7[0] = -((char)*__s1 == 'L');
        auVar7[1] = -(*(char *)((long)__s1 + 1) == 'I');
        auVar7[2] = -(*(char *)((long)__s1 + 2) == 'N');
        auVar7[3] = -(*(char *)((long)__s1 + 3) == 'K');
        auVar7[4] = -(*(char *)((long)__s1 + 4) == '_');
        auVar7[5] = -(*(char *)((long)__s1 + 5) == 'I');
        auVar7[6] = -(*(char *)((long)__s1 + 6) == 'N');
        auVar7[7] = -(*(char *)((long)__s1 + 7) == 'T');
        auVar7[8] = -((char)__s1[1] == 'E');
        auVar7[9] = -(*(char *)((long)__s1 + 9) == 'R');
        auVar7[10] = -(*(char *)((long)__s1 + 10) == 'F');
        auVar7[0xb] = -(*(char *)((long)__s1 + 0xb) == 'A');
        auVar7[0xc] = -(*(char *)((long)__s1 + 0xc) == 'C');
        auVar7[0xd] = -(*(char *)((long)__s1 + 0xd) == 'E');
        auVar7[0xe] = -(*(char *)((long)__s1 + 0xe) == '_');
        auVar7[0xf] = -(*(char *)((long)__s1 + 0xf) == 'L');
        auVar7 = auVar7 & auVar10;
        if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
          return true;
        }
      }
LAB_004d20e0:
      __str._M_str = "LINK_INTERFACE_LIBRARIES_";
      __str._M_len = 0x19;
      local_28._M_len = sVar2;
      local_28._M_str = (char *)__s1;
      iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_28,0,0x19,__str)
      ;
      if (iVar3 != 0) {
        __str_00._M_str = "IMPORTED_LINK_INTERFACE_LIBRARIES_";
        __str_00._M_len = 0x22;
        local_28._M_len = sVar2;
        local_28._M_str = (char *)__s1;
        iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          (&local_28,0,0x22,__str_00);
        bVar5 = 1 < genex - LINK_LIBRARY;
        if (!bVar5 || iVar3 == 0) {
          return iVar3 == 0 || bVar5;
        }
        if (sVar2 == 0x27) {
          iVar3 = bcmp(__s1,"INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE",0x27);
          return iVar3 == 0;
        }
        goto LAB_004d2165;
      }
    }
    else if (sVar2 == 0x1f) {
      auVar11[0] = -(*(char *)((long)__s1 + 0xf) == 'L');
      auVar11[1] = -((char)__s1[2] == 'I');
      auVar11[2] = -(*(char *)((long)__s1 + 0x11) == 'B');
      auVar11[3] = -(*(char *)((long)__s1 + 0x12) == 'R');
      auVar11[4] = -(*(char *)((long)__s1 + 0x13) == 'A');
      auVar11[5] = -(*(char *)((long)__s1 + 0x14) == 'R');
      auVar11[6] = -(*(char *)((long)__s1 + 0x15) == 'I');
      auVar11[7] = -(*(char *)((long)__s1 + 0x16) == 'E');
      auVar11[8] = -(*(char *)((long)__s1 + 0x17) == 'S');
      auVar11[9] = -((char)__s1[3] == '_');
      auVar11[10] = -(*(char *)((long)__s1 + 0x19) == 'D');
      auVar11[0xb] = -(*(char *)((long)__s1 + 0x1a) == 'I');
      auVar11[0xc] = -(*(char *)((long)__s1 + 0x1b) == 'R');
      auVar11[0xd] = -(*(char *)((long)__s1 + 0x1c) == 'E');
      auVar11[0xe] = -(*(char *)((long)__s1 + 0x1d) == 'C');
      auVar11[0xf] = -(*(char *)((long)__s1 + 0x1e) == 'T');
      auVar8[0] = -((char)*__s1 == 'I');
      auVar8[1] = -(*(char *)((long)__s1 + 1) == 'N');
      auVar8[2] = -(*(char *)((long)__s1 + 2) == 'T');
      auVar8[3] = -(*(char *)((long)__s1 + 3) == 'E');
      auVar8[4] = -(*(char *)((long)__s1 + 4) == 'R');
      auVar8[5] = -(*(char *)((long)__s1 + 5) == 'F');
      auVar8[6] = -(*(char *)((long)__s1 + 6) == 'A');
      auVar8[7] = -(*(char *)((long)__s1 + 7) == 'C');
      auVar8[8] = -((char)__s1[1] == 'E');
      auVar8[9] = -(*(char *)((long)__s1 + 9) == '_');
      auVar8[10] = -(*(char *)((long)__s1 + 10) == 'L');
      auVar8[0xb] = -(*(char *)((long)__s1 + 0xb) == 'I');
      auVar8[0xc] = -(*(char *)((long)__s1 + 0xc) == 'N');
      auVar8[0xd] = -(*(char *)((long)__s1 + 0xd) == 'K');
      auVar8[0xe] = -(*(char *)((long)__s1 + 0xe) == '_');
      auVar8[0xf] = -(*(char *)((long)__s1 + 0xf) == 'L');
      auVar8 = auVar8 & auVar11;
      if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff) goto LAB_004d20e0;
    }
    else if ((sVar2 != 0x21) ||
            (iVar3 = bcmp(__s1,"IMPORTED_LINK_INTERFACE_LIBRARIES",0x21), iVar3 != 0))
    goto LAB_004d20e0;
LAB_004d2140:
    bVar5 = true;
  }
  else {
    if (sVar2 == 0xe && tgt == pcVar4->Target) {
      return *(long *)((long)__s1 + 6) == 0x5345495241524249 && *__s1 == 0x42494c5f4b4e494c;
    }
LAB_004d2165:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(
  cmGeneratorTarget const* tgt, ForGenex genex) const
{
  const auto* top = this->Top();

  cm::string_view prop(top->Property);

  if (tgt) {
    return top->Target == tgt && prop == "LINK_LIBRARIES"_s;
  }

  auto result = prop == "LINK_LIBRARIES"_s ||
    prop == "INTERFACE_LINK_LIBRARIES"_s ||
    prop == "INTERFACE_LINK_LIBRARIES_DIRECT"_s ||
    prop == "LINK_INTERFACE_LIBRARIES"_s ||
    prop == "IMPORTED_LINK_INTERFACE_LIBRARIES"_s ||
    cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES_") ||
    cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES_");

  return genex == ForGenex::LINK_LIBRARY || genex == ForGenex::LINK_GROUP
    ? result
    : (result || prop == "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE"_s);
}